

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath1Function<&cos>::RealMath1Function
          (RealMath1Function<&cos> *this,Builtins *builtins,KnownSystemName knownNameId)

{
  initializer_list<const_slang::ast::Type_*> __l;
  iterator ppTVar1;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 uVar2;
  Type *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffb0;
  _Alloc_hider this_00;
  
  ppTVar1 = (iterator)(in_RSI + 0x4d0);
  this_00._M_p = &stack0xffffffffffffffb8;
  uVar2 = (undefined2)((ulong)&stack0xffffffffffffffb7 >> 0x30);
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x135579f);
  __l._M_len = (size_type)this_00._M_p;
  __l._M_array = ppTVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (in_stack_ffffffffffffffb0,__l,in_stack_ffffffffffffffa8);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            ((SimpleSystemSubroutine *)this_00._M_p,(KnownSystemName)((ulong)ppTVar1 >> 0x20),
             (SubroutineKind)ppTVar1,(size_t)in_stack_ffffffffffffffb0,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,SUB21((ushort)uVar2 >> 8,0),
             SUB21(uVar2,0));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffff90));
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)&stack0xffffffffffffffb7);
  *in_RDI = &PTR__RealMath1Function_01a2b470;
  return;
}

Assistant:

RealMath1Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.realType},
                               builtins.realType, false) {}